

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int bindText(sqlite3_stmt *pStmt,int i,void *zData,int nData,_func_void_void_ptr *xDel,u8 encoding)

{
  sqlite3 *psVar1;
  int iVar2;
  uint uVar3;
  uint err_code;
  long lVar4;
  Mem *pMem;
  
  iVar2 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar2 != 0) {
    if (xDel + 1 < (code *)0x2) {
      return iVar2;
    }
    (*xDel)(zData);
    return iVar2;
  }
  uVar3 = 0;
  if (zData != (void *)0x0) {
    lVar4 = *(long *)(pStmt + 0x80);
    pMem = (Mem *)(lVar4 + (long)i * 0x38 + -0x38);
    err_code = sqlite3VdbeMemSetStr(pMem,(char *)zData,nData,encoding,xDel);
    if ((encoding != '\0') && (err_code == 0)) {
      lVar4 = lVar4 + (long)i * 0x38;
      if (((*(byte *)(lVar4 + -0x30) & 2) == 0) ||
         (*(u8 *)(lVar4 + -0x2e) == *(u8 *)(*(long *)pStmt + 0x5e))) {
        uVar3 = 0;
        goto LAB_00138b50;
      }
      err_code = sqlite3VdbeMemTranslate(pMem,*(u8 *)(*(long *)pStmt + 0x5e));
    }
    uVar3 = 0;
    if (err_code != 0) {
      psVar1 = *(sqlite3 **)pStmt;
      psVar1->errCode = err_code;
      sqlite3ErrorFinish(psVar1,err_code);
      psVar1 = *(sqlite3 **)pStmt;
      if ((err_code == 0xc0a) || (psVar1->mallocFailed != '\0')) {
        apiOomError(psVar1);
        uVar3 = 7;
      }
      else {
        uVar3 = err_code & psVar1->errMask;
      }
    }
  }
LAB_00138b50:
  if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return uVar3;
}

Assistant:

static int bindText(
  sqlite3_stmt *pStmt,   /* The statement to bind against */
  int i,                 /* Index of the parameter to bind */
  const void *zData,     /* Pointer to the data to be bound */
  int nData,             /* Number of bytes of data to be bound */
  void (*xDel)(void*),   /* Destructor for the data */
  u8 encoding            /* Encoding for the data */
){
  Vdbe *p = (Vdbe *)pStmt;
  Mem *pVar;
  int rc;

  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    if( zData!=0 ){
      pVar = &p->aVar[i-1];
      rc = sqlite3VdbeMemSetStr(pVar, zData, nData, encoding, xDel);
      if( rc==SQLITE_OK && encoding!=0 ){
        rc = sqlite3VdbeChangeEncoding(pVar, ENC(p->db));
      }
      if( rc ){
        sqlite3Error(p->db, rc);
        rc = sqlite3ApiExit(p->db, rc);
      }
    }
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDel!=SQLITE_STATIC && xDel!=SQLITE_TRANSIENT ){
    xDel((void*)zData);
  }
  return rc;
}